

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void input_binary(_Bool *target,size_t length,char *prompt)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  ulong local_438;
  size_t n;
  char local_428 [7];
  _Bool is_valid;
  char input [1024];
  char *prompt_local;
  size_t length_local;
  _Bool *target_local;
  
  bVar1 = false;
  while( true ) {
    if (bVar1) {
      return;
    }
    printf("%s",prompt);
    pcVar3 = fgets(local_428,(int)length + 2,_stdin);
    if (pcVar3 == (char *)0x0) break;
    bVar1 = true;
    local_438 = 0;
    while( true ) {
      bVar2 = false;
      if (local_438 < length) {
        bVar2 = bVar1;
      }
      if (!bVar2) break;
      if (local_428[local_438] == '0') {
        target[(length - local_438) + -1] = false;
      }
      else if (local_428[local_438] == '1') {
        target[(length - local_438) + -1] = true;
      }
      else {
        bVar1 = false;
      }
      local_438 = local_438 + 1;
    }
  }
  exit(1);
}

Assistant:

void input_binary(bool* target, const size_t length, const char* prompt) {
  char input[1024]; // should be plenty enough

  bool is_valid = false;
  while (!is_valid) {
    printf("%s", prompt);
    if (!fgets(input, (int)(length + 2), stdin)) exit(1);

    is_valid = true;

    for (size_t n = 0; n < length && is_valid; n++) {
      if (input[n] == '0') target[length - n - 1] = false;
      else if (input[n] == '1') target[length - n - 1] = true;
      else is_valid = false;
    }
  }
}